

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderList
          (StatusOr<unsigned_int> *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field
          ,StringPiece name,uint32 list_tag,ObjectWriter *ow)

{
  byte bVar1;
  CodedInputStream *pCVar2;
  byte *pbVar3;
  uint32 uVar4;
  uint32 uVar5;
  undefined8 uVar6;
  undefined1 local_60 [8];
  Status _status;
  
  _status.error_message_.field_2._8_8_ = __return_storage_ptr__;
  (*ow->_vptr_ObjectWriter[4])(ow,name.ptr_,name.length_);
  if (((field->cardinality_ != 3) || (0xfffffffb < field->kind_ - 0xdU)) ||
     (field->number_ * 8 + 2U != list_tag)) {
    do {
      (*(this->super_ObjectSource)._vptr_ObjectSource[6])(local_60,this,field,"",0,ow);
      uVar6 = _status.error_message_.field_2._8_8_;
      if (local_60._0_4_ != OK) {
        StatusOr<unsigned_int>::StatusOr
                  ((StatusOr<unsigned_int> *)_status.error_message_.field_2._8_8_,(Status *)local_60
                  );
        goto LAB_003159fd;
      }
      if ((size_type *)_status._0_8_ != &_status.error_message_._M_string_length) {
        operator_delete((void *)_status._0_8_);
      }
      pCVar2 = this->stream_;
      pbVar3 = pCVar2->buffer_;
      if (pbVar3 < pCVar2->buffer_end_) {
        bVar1 = *pbVar3;
        uVar4 = (uint32)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003159ce;
        pCVar2->buffer_ = pbVar3 + 1;
      }
      else {
        uVar5 = 0;
LAB_003159ce:
        uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar5);
      }
      pCVar2->last_tag_ = uVar4;
    } while (uVar4 == list_tag);
    goto LAB_00315a35;
  }
  RenderPacked((Status *)local_60,this,field,ow);
  uVar6 = _status.error_message_.field_2._8_8_;
  if (local_60._0_4_ != OK) {
    StatusOr<unsigned_int>::StatusOr
              ((StatusOr<unsigned_int> *)_status.error_message_.field_2._8_8_,(Status *)local_60);
LAB_003159fd:
    if ((size_type *)_status._0_8_ == &_status.error_message_._M_string_length) {
      return (StatusOr<unsigned_int> *)uVar6;
    }
    operator_delete((void *)_status._0_8_);
    return (StatusOr<unsigned_int> *)uVar6;
  }
  if ((size_type *)_status._0_8_ != &_status.error_message_._M_string_length) {
    operator_delete((void *)_status._0_8_);
  }
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  if (pbVar3 < pCVar2->buffer_end_) {
    bVar1 = *pbVar3;
    uVar4 = (uint32)bVar1;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\0') goto LAB_00315a25;
    pCVar2->buffer_ = pbVar3 + 1;
  }
  else {
    uVar5 = 0;
LAB_00315a25:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar5);
  }
  pCVar2->last_tag_ = uVar4;
LAB_00315a35:
  (*ow->_vptr_ObjectWriter[5])();
  uVar6 = _status.error_message_.field_2._8_8_;
  Status::Status((Status *)_status.error_message_.field_2._8_8_);
  Status::operator=((Status *)uVar6,(Status *)Status::OK);
  *(uint32 *)(uVar6 + 0x28) = uVar4;
  return (StatusOr<unsigned_int> *)uVar6;
}

Assistant:

StatusOr<uint32> ProtoStreamObjectSource::RenderList(
    const google::protobuf::Field* field, StringPiece name,
    uint32 list_tag, ObjectWriter* ow) const {
  uint32 tag_to_return = 0;
  ow->StartList(name);
  if (IsPackable(*field) &&
      list_tag ==
          WireFormatLite::MakeTag(field->number(),
                                  WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    RETURN_IF_ERROR(RenderPacked(field, ow));
    // Since packed fields have a single tag, read another tag from stream to
    // return.
    tag_to_return = stream_->ReadTag();
  } else {
    do {
      RETURN_IF_ERROR(RenderField(field, "", ow));
    } while ((tag_to_return = stream_->ReadTag()) == list_tag);
  }
  ow->EndList();
  return tag_to_return;
}